

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O1

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::polyline
          (ImGuiDrawListGraphicsAdaptor *this,
          vector<nivalis::point,_std::allocator<nivalis::point>_> *points,color *c,float thickness,
          bool closed,bool fill)

{
  pointer ppVar1;
  ImDrawList *pIVar2;
  point *points_00;
  undefined1 this_00 [8];
  ImU32 IVar3;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *extraout_RDX;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *extraout_RDX_00;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  *poly_00;
  pointer puVar4;
  undefined7 in_register_00000081;
  ulong uVar5;
  point *p;
  pointer ppVar6;
  vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
  poly;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *local_88;
  float local_74;
  undefined1 local_70 [8];
  pointer local_68;
  pointer local_60;
  ImVec4 local_58;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if ((int)CONCAT71(in_register_00000081,fill) == 0) {
    pIVar2 = this->draw_list;
    points_00 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>).
                _M_impl.super__Vector_impl_data._M_start;
    ppVar6 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    local_98._4_4_ = *c->g;
    local_98._0_4_ = *c->r;
    uStack_90 = (vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
                CONCAT44(*c->a,*c->b);
    local_74 = thickness;
    IVar3 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_98);
    ImDrawList::AddPolyline<nivalis::point>
              (pIVar2,points_00,(int)((ulong)((long)ppVar6 - (long)points_00) >> 3) * -0x55555555,
               IVar3,closed,local_74);
  }
  else {
    local_98 = (undefined1  [8])0x0;
    uStack_90 = (vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)0x0;
    local_88 = (vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)0x0;
    local_98 = (undefined1  [8])operator_new(0x18);
    uStack_90 = (vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)
                ((long)local_98 + 0x18);
    *(long *)local_98 = 0;
    *(long *)((long)local_98 + 8) = 0;
    *(long *)((long)local_98 + 0x10) = 0;
    ppVar6 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ppVar1 = (points->super__Vector_base<nivalis::point,_std::allocator<nivalis::point>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    poly_00 = extraout_RDX;
    local_88 = uStack_90;
    if (ppVar6 != ppVar1) {
      do {
        this_00 = local_98;
        local_70._0_4_ = point::operator[](ppVar6,0);
        local_70._4_4_ = point::operator[](ppVar6,1);
        std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
        emplace_back<std::array<float,2ul>>
                  ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>> *)this_00,
                   (array<float,_2UL> *)local_70);
        ppVar6 = ppVar6 + 1;
        poly_00 = extraout_RDX_00;
      } while (ppVar6 != ppVar1);
    }
    mapbox::
    earcut<unsigned_int,std::vector<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>,std::allocator<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>>>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70,(mapbox *)local_98,
               poly_00);
    puVar4 = (pointer)CONCAT44(local_70._4_4_,local_70._0_4_);
    if (local_68 != puVar4) {
      uVar5 = 0;
      do {
        pIVar2 = this->draw_list;
        local_38 = *(ImVec2 *)(*(long *)local_98 + (ulong)puVar4[uVar5] * 8);
        local_40 = *(ImVec2 *)(*(long *)local_98 + (ulong)puVar4[uVar5 + 1] * 8);
        local_48 = *(ImVec2 *)(*(long *)local_98 + (ulong)puVar4[uVar5 + 2] * 8);
        local_58.y = *c->g;
        local_58.x = *c->r;
        local_58.w = *c->a;
        local_58.z = *c->b;
        IVar3 = ImGui::ColorConvertFloat4ToU32(&local_58);
        ImDrawList::AddTriangleFilled(pIVar2,&local_38,&local_40,&local_48,IVar3);
        uVar5 = uVar5 + 3;
        puVar4 = (pointer)CONCAT44(local_70._4_4_,local_70._0_4_);
      } while (uVar5 < (ulong)((long)local_68 - (long)puVar4 >> 2));
    }
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4,(long)local_60 - (long)puVar4);
    }
    std::
    vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
    ::~vector((vector<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>,_std::allocator<std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>_>_>
               *)local_98);
  }
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::polyline(const std::vector<point>& points,
                                            const color::color& c,
                                            float thickness, bool closed,
                                            bool fill) {
    if (fill) {
        std::vector<std::vector<ECPoint>> poly(1);
        for (auto& p : points) poly[0].push_back({p[0], p[1]});
        std::vector<ECInt> indices = mapbox::earcut<ECInt>(poly);
        for (size_t t = 0; t < indices.size(); t += 3) {
            const auto i = indices[t], j = indices[t + 1], k = indices[t + 2];
            draw_list->AddTriangleFilled(ImVec2(poly[0][i][0], poly[0][i][1]),
                                         ImVec2(poly[0][j][0], poly[0][j][1]),
                                         ImVec2(poly[0][k][0], poly[0][k][1]),
                                         ImColor(c.r, c.g, c.b, c.a));
        }
    } else {
        draw_list->AddPolyline<point>(&points[0], points.size(),
                                      ImColor(c.r, c.g, c.b, c.a), closed,
                                      thickness);
    }
}